

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::RegistryTest_merge_same_families_Test::TestBody
          (RegistryTest_merge_same_families_Test *this)

{
  Builder<prometheus::Counter> *pBVar1;
  Family<prometheus::Counter> *this_00;
  char *message;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  AssertionResult gtest_ar;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> collected;
  Registry registry;
  allocator_type local_202;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_201;
  string local_200;
  string local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  undefined1 local_150 [48];
  _Alloc_hider local_120;
  char local_110 [16];
  _Alloc_hider local_100;
  char local_f0 [16];
  Registry local_e0;
  
  Registry::Registry(&local_e0,Merge);
  lVar2 = -4;
  do {
    BuildCounter();
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"counter","");
    pBVar1 = detail::Builder<prometheus::Counter>::Name
                       ((Builder<prometheus::Counter> *)local_150,&local_200);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"Test Counter","");
    pBVar1 = detail::Builder<prometheus::Counter>::Help(pBVar1,&local_1e0);
    this_00 = detail::Builder<prometheus::Counter>::Register(pBVar1,&local_e0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[5],_const_char_(&)[13],_true>
              (&local_1c0,(char (*) [5])0x18445f,(char (*) [13])"test_counter");
    __l._M_len = 1;
    __l._M_array = &local_1c0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_180,__l,&local_201,&local_202);
    Family<prometheus::Counter>::Add<>(this_00,(Labels *)&local_180);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.second._M_dataplus._M_p != &local_1c0.second.field_2) {
      operator_delete(local_1c0.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1c0.first._M_dataplus._M_p._1_7_,(char)local_1c0.first._M_dataplus._M_p)
        != &local_1c0.first.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1c0.first._M_dataplus._M_p._1_7_,
                               (char)local_1c0.first._M_dataplus._M_p));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if (local_100._M_p != local_f0) {
      operator_delete(local_100._M_p);
    }
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_150);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  Registry::Collect((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
                    local_150,&local_e0);
  local_200._M_dataplus._M_p._0_4_ = 1;
  local_180._M_impl._0_8_ = ((long)(local_150._8_8_ - local_150._0_8_) >> 5) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_1c0,"1U","collected.size()",(uint *)&local_200,
             (unsigned_long *)&local_180);
  if ((char)local_1c0.first._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_1c0.first._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_1c0.first._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
               ,0x88,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_200,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_200);
    if ((long *)local_180._M_impl._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_180._M_impl._0_8_ + 8))();
    }
  }
  if ((undefined8 *)local_1c0.first._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1c0.first._M_string_length !=
        (undefined8 *)(local_1c0.first._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1c0.first._M_string_length);
    }
    operator_delete((void *)local_1c0.first._M_string_length);
  }
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
            ((vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *)
             local_150);
  Registry::~Registry(&local_e0);
  return;
}

Assistant:

TEST(RegistryTest, merge_same_families) {
  Registry registry{Registry::InsertBehavior::Merge};

  std::size_t loops = 4;

  while (loops-- > 0) {
    BuildCounter()
        .Name("counter")
        .Help("Test Counter")
        .Register(registry)
        .Add({{"name", "test_counter"}});
  }

  auto collected = registry.Collect();
  EXPECT_EQ(1U, collected.size());
}